

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json2map.c
# Opt level: O3

int json2map_parseObject
              (json2map_t *obj,char *path,char *jsonString,jsmntok_t *token,int start,int end)

{
  int iVar1;
  jsmntype_t jVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  csafestring_t *obj_00;
  csafestring_t *pcVar6;
  csafestring_t *pcVar7;
  char *__dest;
  int *piVar8;
  csafestring_t *obj_01;
  ulong uVar9;
  int iVar10;
  int end_00;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  uint arrayIdx;
  long lVar16;
  char smallBuffer [25];
  char local_58 [40];
  
  uVar15 = (ulong)(uint)start;
  if (0 < start && start < end) {
    do {
      if (token[uVar15].type != JSMN_STRING) {
        return -1;
      }
      iVar1 = token[uVar15].start;
      lVar14 = (long)token[uVar15].end - (long)iVar1;
      pcVar5 = (char *)calloc(1,lVar14 + 1);
      memcpy(pcVar5,jsonString + iVar1,(long)(int)lVar14);
      obj_00 = json2map_concatPaths(path,pcVar5,-1);
      free(pcVar5);
      lVar14 = uVar15 + 1;
      jVar2 = token[lVar14].type;
      iVar1 = (int)uVar15;
      if (jVar2 - JSMN_STRING < 2) {
        iVar10 = token[lVar14].start;
        lVar14 = (long)token[lVar14].end - (long)iVar10;
        pcVar5 = (char *)calloc(1,lVar14 + 1);
        memcpy(pcVar5,jsonString + iVar10,(long)(int)lVar14);
        if (obj->dataMapHook != (_func_void_void_ptr_char_ptr_char_ptr *)0x0) {
          (*obj->dataMapHook)(obj->dataMapData,obj_00->data,pcVar5);
        }
        free(pcVar5);
        uVar4 = iVar1 + 2;
LAB_00106469:
        uVar15 = (ulong)uVar4;
      }
      else {
        if (jVar2 != JSMN_ARRAY) {
          if (jVar2 != JSMN_OBJECT) {
            return -1;
          }
          iVar10 = iVar1 + 1;
          piVar8 = &token[uVar15 + 2].start;
          lVar16 = uVar15 + 2;
          do {
            end_00 = end;
            if (end <= lVar16) break;
            iVar3 = *piVar8;
            iVar10 = iVar10 + 1;
            piVar8 = piVar8 + 4;
            lVar16 = lVar16 + 1;
            end_00 = iVar10;
          } while (iVar3 <= token[lVar14].end);
          if (obj->saveSubobjectString != '\0') {
            pcVar6 = safe_clone(obj_00);
            safe_strchrappend(pcVar6,'[');
            safe_strchrappend(pcVar6,'o');
            safe_strchrappend(pcVar6,']');
            pcVar7 = safe_create((char *)0x0);
            safe_memset(pcVar7,0,(long)((token[lVar14].end - token[lVar14].start) + 1));
            safe_memcpy(pcVar7,jsonString + token[lVar14].start,
                        (long)token[lVar14].end - (long)token[lVar14].start);
            (*obj->dataMapHook)(obj->dataMapData,pcVar6->data,pcVar7->data);
            safe_destroy(pcVar7);
            safe_destroy(pcVar6);
          }
          uVar4 = json2map_parseObject(obj,obj_00->data,jsonString,token,iVar1 + 2,end_00);
          goto LAB_00106469;
        }
        piVar8 = &token[uVar15 + 2].start;
        lVar16 = uVar15 + 2;
        do {
          uVar4 = end - 1;
          if (end <= lVar16) break;
          iVar10 = *piVar8;
          uVar4 = (int)uVar15 + 1;
          uVar15 = (ulong)uVar4;
          piVar8 = piVar8 + 4;
          lVar16 = lVar16 + 1;
        } while (iVar10 <= token[lVar14].end);
        pcVar5 = obj_00->data;
        uVar11 = iVar1 + 2;
        if (iVar1 < -1 || (int)uVar4 < (int)uVar11) {
          uVar15 = 0;
        }
        else {
          arrayIdx = 0;
          do {
            pcVar6 = json2map_concatPaths((char *)0x0,pcVar5,arrayIdx);
            uVar15 = (ulong)uVar11;
            if (token[uVar15].type - JSMN_STRING < 2) {
              iVar1 = token[uVar15].start;
              lVar14 = (long)token[uVar15].end - (long)iVar1;
              __dest = (char *)calloc(1,lVar14 + 1);
              memcpy(__dest,jsonString + iVar1,(long)(int)lVar14);
              if (obj->dataMapHook != (_func_void_void_ptr_char_ptr_char_ptr *)0x0) {
                (*obj->dataMapHook)(obj->dataMapData,pcVar6->data,__dest);
              }
              free(__dest);
              uVar11 = uVar11 + 1;
            }
            else {
              if (token[uVar15].type != JSMN_OBJECT) {
                uVar15 = 0xffffffff;
                goto LAB_001066dc;
              }
              uVar12 = uVar11 - 1;
              piVar8 = &token[uVar15 + 1].start;
              uVar9 = uVar15;
              do {
                uVar9 = uVar9 + 1;
                uVar13 = uVar4;
                if ((long)(int)(uVar4 + 1) <= (long)uVar9) break;
                iVar1 = *piVar8;
                uVar12 = uVar12 + 1;
                piVar8 = piVar8 + 4;
                uVar13 = uVar12;
              } while (iVar1 <= token[uVar15].end);
              if (obj->saveSubobjectString != '\0') {
                pcVar7 = safe_clone(pcVar6);
                safe_strchrappend(pcVar7,'[');
                safe_strchrappend(pcVar7,'o');
                safe_strchrappend(pcVar7,']');
                obj_01 = safe_create((char *)0x0);
                safe_memset(obj_01,0,(long)((token[uVar15].end - token[uVar15].start) + 1));
                safe_memcpy(obj_01,jsonString + token[uVar15].start,
                            (long)token[uVar15].end - (long)token[uVar15].start);
                (*obj->dataMapHook)(obj->dataMapData,pcVar7->data,obj_01->data);
                safe_destroy(obj_01);
                safe_destroy(pcVar7);
              }
              uVar11 = json2map_parseObject(obj,pcVar6->data,jsonString,token,uVar11 + 1,uVar13 + 1)
              ;
            }
            arrayIdx = arrayIdx + 1;
            safe_destroy(pcVar6);
          } while (((int)uVar11 <= (int)uVar4) && (0 < (int)uVar11));
          uVar15 = (ulong)arrayIdx;
        }
        pcVar6 = json2map_concatPaths((char *)0x0,pcVar5,-2);
        stringlib_longToString(local_58,uVar15);
        if (obj->dataMapHook != (_func_void_void_ptr_char_ptr_char_ptr *)0x0) {
          (*obj->dataMapHook)(obj->dataMapData,pcVar6->data,local_58);
        }
        safe_destroy(pcVar6);
        uVar4 = uVar4 + 1;
        if ((int)uVar11 < 0) {
          uVar4 = uVar11;
        }
        uVar15 = (ulong)uVar4;
      }
LAB_001066dc:
      safe_destroy(obj_00);
    } while (((int)uVar15 < end) && (0 < (int)uVar15));
  }
  if ((int)uVar15 < 0) {
    end = (int)uVar15;
  }
  return end;
}

Assistant:

static int json2map_parseObject(json2map_t *obj, char *path, char *jsonString, jsmntok_t *token, int start, int end) {
	DEBUG_TEXT("json2map_parseObject([json2map_t *], %s, %s, [jsmntok_t *], %d, %d)...", path, jsonString, start, end);

	int newEnd;
	char *buffer;
	csafestring_t *pathBuff = NULL;
	csafestring_t *objPathBuff = NULL;

	int i = start;
	while ( i < end && i > 0 ) {
		if ( token[i].type == JSMN_STRING ) {
			buffer = json2map_setTokenValue(jsonString, &token[i]);
			pathBuff = json2map_concatPaths(path, buffer, -1);
			free(buffer);
		} else {
			DEBUG_TEXT("json2map_parseObject([json2map_t *], %s, %s, [jsmntok_t *], %d, %d): ERROR: Name of object has to be a string", path, jsonString, start, end);
			return -1;
		}
		i++;

		switch ( token[i].type ) {
			case JSMN_OBJECT:
				newEnd = json2map_calcEnd(token, i, end);

				if ( obj->saveSubobjectString ) {
					objPathBuff = safe_clone(pathBuff);
					safe_strchrappend(objPathBuff, JSON2MAP_MAP_ARRAY_START);
					safe_strchrappend(objPathBuff, JSON2MAP_MAP_OBJECT_CODE);
					safe_strchrappend(objPathBuff, JSON2MAP_MAP_ARRAY_END);
					
					csafestring_t *tmp = safe_create(NULL);
					safe_memset(tmp, '\0', token[i].end - token[i].start + 1);
					safe_memcpy(tmp, &jsonString[token[i].start], token[i].end - token[i].start);

					obj->dataMapHook(obj->dataMapData, objPathBuff->data, tmp->data);
					safe_destroy(tmp);
					safe_destroy(objPathBuff);
				}

				i = json2map_parseObject(obj, pathBuff->data, jsonString, token, i + 1, newEnd + 1);
				break;
			case JSMN_STRING:
			case JSMN_PRIMITIVE:
				buffer = json2map_setTokenValue(jsonString, &token[i]);
				if ( obj->dataMapHook != NULL ) {
					obj->dataMapHook(obj->dataMapData, pathBuff->data, buffer);
				}
				free(buffer);
				i++;
				break;
			case JSMN_ARRAY:
				newEnd = json2map_calcEnd(token, i, end);
				i = json2map_parseArray(obj, pathBuff->data, jsonString, token, i + 1, newEnd + 1);
				break;
			default:
				DEBUG_TEXT("json2map_parseObject([json2map_t *], %s, %s, [jsmntok_t *], %d, %d): ERROR: Not defined type", path, jsonString, start, end);
				return -1;
		}
		safe_destroy(pathBuff);
	}

	DEBUG_TEXT("json2map_parseObject([json2map_t *], %s, %s, [jsmntok_t *], %d, %d)... DONE", path, jsonString, start, end);
	if ( i < 0 ) {
		return i;
	}
	return end;
}